

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O0

void __thiscall
ScriptElement_ConvertBinaryToNumber_Test::TestBody(ScriptElement_ConvertBinaryToNumber_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *message;
  char *in_R9;
  AssertHelper local_318;
  Message local_310;
  undefined4 local_304;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_2d0;
  Message local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_248;
  Message local_240;
  undefined4 local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_200;
  Message local_1f8;
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__1;
  string local_1d0;
  ByteData local_1b0;
  ScriptElement local_198;
  AssertHelper local_138;
  Message local_130;
  int local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  AssertHelper local_f0;
  Message local_e8;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_;
  int64_t converted;
  allocator local_a9;
  string local_a8;
  ByteData local_88;
  undefined1 local_70 [8];
  ScriptElement bi_num_elem;
  ScriptElement_ConvertBinaryToNumber_Test *this_local;
  
  bi_num_elem.value_ = (int64_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"ff7f",&local_a9);
  cfd::core::ByteData::ByteData(&local_88,&local_a8);
  cfd::core::ScriptElement::ScriptElement((ScriptElement *)local_70,&local_88);
  cfd::core::ByteData::~ByteData(&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  local_d9 = cfd::core::ScriptElement::ConvertBinaryToNumber
                       ((ScriptElement *)local_70,(int64_t *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_d8,
               (AssertionResult *)"bi_num_elem.ConvertBinaryToNumber(&converted)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_124 = 0x7fff;
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_120,"32767","converted",&local_124,(long *)&gtest_ar_.message_
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d0,"ffffffffffff",(allocator *)((long)&gtest_ar__1.message_.ptr_ + 7)
            );
  cfd::core::ByteData::ByteData(&local_1b0,&local_1d0);
  cfd::core::ScriptElement::ScriptElement(&local_198,&local_1b0);
  cfd::core::ScriptElement::operator=((ScriptElement *)local_70,&local_198);
  cfd::core::ScriptElement::~ScriptElement(&local_198);
  cfd::core::ByteData::~ByteData(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  bVar1 = cfd::core::ScriptElement::ConvertBinaryToNumber
                    ((ScriptElement *)local_70,(int64_t *)&gtest_ar_.message_);
  local_1e9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_1e8,
               (AssertionResult *)"bi_num_elem.ConvertBinaryToNumber(&converted)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  local_234 = 0;
  pcVar2 = (char *)0x0;
  testing::internal::EqHelper<true>::Compare<int,long>
            (local_230,"0",(int *)"converted",(long *)&local_234,&gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x6a,message);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  cfd::core::ScriptElement::ScriptElement
            ((ScriptElement *)&gtest_ar__2.message_,
             (ScriptOperator *)cfd::core::ScriptOperator::OP_12);
  cfd::core::ScriptElement::operator=
            ((ScriptElement *)local_70,(ScriptElement *)&gtest_ar__2.message_);
  cfd::core::ScriptElement::~ScriptElement((ScriptElement *)&gtest_ar__2.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  bVar1 = cfd::core::ScriptElement::ConvertBinaryToNumber
                    ((ScriptElement *)local_70,(int64_t *)&gtest_ar_.message_);
  local_2b9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_2b8,
               (AssertionResult *)"bi_num_elem.ConvertBinaryToNumber(&converted)","true","false",
               pcVar2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_304 = 0;
  testing::internal::EqHelper<true>::Compare<int,long>
            (local_300,"0",(int *)"converted",(long *)&local_304,&gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  cfd::core::ScriptElement::~ScriptElement((ScriptElement *)local_70);
  return;
}

Assistant:

TEST(ScriptElement, ConvertBinaryToNumber) {
  ScriptElement bi_num_elem = ScriptElement(ByteData("ff7f"));
  int64_t converted = 0;
  EXPECT_TRUE(bi_num_elem.ConvertBinaryToNumber(&converted));
  EXPECT_EQ(32767, converted);

  bi_num_elem = ScriptElement(ByteData("ffffffffffff"));
  converted = 0;
  EXPECT_FALSE(bi_num_elem.ConvertBinaryToNumber(&converted));
  EXPECT_EQ(0, converted);

  bi_num_elem = ScriptElement(ScriptOperator::OP_12);
  converted = 0;
  EXPECT_FALSE(bi_num_elem.ConvertBinaryToNumber(&converted));
  EXPECT_EQ(0, converted);
}